

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C++20Support.hpp
# Opt level: O1

string * webfront::http::std::format<int>(string *__return_storage_ptr__,string_view fmt,int *ts)

{
  char *pcVar1;
  ostream *this;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  stringstream ss;
  long alStack_3b8 [2];
  char *local_3a8;
  long alStack_3a0 [62];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  pcVar4 = fmt._M_str;
  sVar7 = fmt._M_len;
  uVar8 = 0;
  memset(alStack_3b8 + 1,0,0x200);
  pcVar1 = pcVar4 + sVar7;
  pcVar3 = pcVar4;
  if (sVar7 != 0) {
    uVar8 = 0;
    pcVar2 = pcVar4;
    pcVar5 = pcVar4;
    pcVar6 = pcVar4;
    do {
      pcVar3 = pcVar6;
      if ((*pcVar6 != '}') && (pcVar3 = pcVar2, *pcVar6 == '{')) {
        if (pcVar2 == pcVar4) {
          alStack_3b8[uVar8 * 2 + 1] = (long)pcVar5 - (long)pcVar2;
          (&local_3a8)[uVar8 * 2] = pcVar2;
          uVar8 = uVar8 + 1;
        }
        else if (uVar8 < 0x20 && pcVar6 != pcVar2) {
          alStack_3b8[uVar8 * 2 + 1] = (long)(pcVar5 + ~(ulong)pcVar2);
          (&local_3a8)[uVar8 * 2] = pcVar2 + 1;
          uVar8 = uVar8 + 1;
        }
      }
      pcVar6 = pcVar6 + 1;
      pcVar5 = pcVar5 + 1;
      sVar7 = sVar7 - 1;
      pcVar2 = pcVar3;
    } while (sVar7 != 0);
  }
  pcVar3 = pcVar3 + 1;
  if (pcVar3 != pcVar1) {
    alStack_3b8[uVar8 * 2 + 1] = (long)pcVar1 - (long)pcVar3;
    (&local_3a8)[uVar8 * 2] = pcVar3;
  }
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  this = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a0,local_3a8,alStack_3b8[1]);
  ::std::ostream::operator<<((ostream *)this,*ts);
  for (lVar9 = 0x18; lVar9 != 0x208; lVar9 = lVar9 + 0x10) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,*(char **)((long)alStack_3b8 + lVar9 + 8U),
               *(long *)((long)alStack_3b8 + lVar9));
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  ::std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string format(std::string_view fmt, auto&&... ts) {
    if (sizeof...(ts) == 0) return std::string(fmt);
    std::array<std::string_view, 32> fragments{};
    if (sizeof...(ts) > fragments.size()) throw std::length_error("format parameters count limit exceeded");
    size_t index = 0;
    auto start = fmt.cbegin(), parser = start;
    while (parser != fmt.cend()) {
        if (*parser == '{') {
            if (start == fmt.cbegin())
                fragments[index++] = std::string_view(start, static_cast<size_t>(parser - start));          /// string_view constructor with iterators is missing in Apple Clang 13
            else if (start != parser && index < fragments.size())
                fragments[index++] = std::string_view(start + 1, static_cast<size_t>(parser - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13
        }
        else if (*parser == '}')
            start = parser;
        ++parser;
    }
    if (start + 1 != fmt.cend()) fragments[index++] = std::string_view(start + 1, static_cast<size_t>(fmt.cend() - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13

    auto frag = fragments.cbegin();
    stringstream ss;
    using webfront::operator<<;
    ((ss << *frag++ << std::forward<decltype(ts)>(ts)), ...);
    while (frag != fragments.cend()) ss << *frag++;
    return ss.str();
}